

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::rescalePartialsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  bool bVar18;
  byte bVar19;
  byte bVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ushort uVar28;
  float fVar29;
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  
  iVar2 = this->gPatternPartitionsStartPatterns[partitionIndex];
  lVar27 = (long)iVar2;
  iVar3 = this->gPatternPartitionsStartPatterns[(long)partitionIndex + 1];
  if (iVar2 < iVar3) {
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      iVar2 = this->kPartialsPaddedStateCount;
      iVar4 = this->kCategoryCount;
      auVar36 = ZEXT816(0) << 0x40;
      auVar37 = ZEXT1664(auVar36);
      if (0 < iVar4) {
        iVar21 = iVar2 * (int)lVar27;
        iVar23 = 0;
        do {
          if (0 < this->kStateCount) {
            lVar25 = 0;
            do {
              auVar36 = vmaxss_avx(ZEXT416((uint)destP[iVar21 + lVar25]),auVar37._0_16_);
              auVar37 = ZEXT1664(auVar36);
              lVar25 = lVar25 + 1;
            } while (this->kStateCount != (int)lVar25);
          }
          auVar36 = auVar37._0_16_;
          iVar23 = iVar23 + 1;
          iVar21 = iVar21 + this->kPaddedPatternCount * iVar2;
        } while (iVar23 != iVar4);
      }
      uVar17 = vcmpss_avx512f(auVar36,ZEXT416(0),0);
      bVar18 = (bool)((byte)uVar17 & 1);
      fVar29 = (float)((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * auVar36._0_4_);
      if (0 < iVar4) {
        iVar21 = this->kStateCount;
        iVar22 = iVar2 * (int)lVar27;
        iVar23 = this->kPaddedPatternCount;
        auVar37 = vpbroadcastq_avx512f();
        auVar32 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar29)));
        iVar24 = 0;
        do {
          if (0 < iVar21) {
            uVar26 = 0;
            do {
              auVar33 = vpbroadcastq_avx512f();
              auVar34 = vporq_avx512f(auVar33,auVar30);
              auVar33 = vporq_avx512f(auVar33,auVar31);
              uVar17 = vpcmpuq_avx512f(auVar33,auVar37,2);
              bVar19 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar34,auVar37,2);
              bVar20 = (byte)uVar17;
              uVar28 = CONCAT11(bVar20,bVar19);
              pfVar1 = destP + (long)iVar22 + uVar26;
              auVar33._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * (int)pfVar1[1];
              auVar33._0_4_ = (uint)(bVar19 & 1) * (int)*pfVar1;
              auVar33._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * (int)pfVar1[2];
              auVar33._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * (int)pfVar1[3];
              auVar33._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * (int)pfVar1[4];
              auVar33._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * (int)pfVar1[5];
              auVar33._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * (int)pfVar1[6];
              auVar33._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * (int)pfVar1[7];
              auVar33._32_4_ = (uint)(bVar20 & 1) * (int)pfVar1[8];
              auVar33._36_4_ = (uint)(bVar20 >> 1 & 1) * (int)pfVar1[9];
              auVar33._40_4_ = (uint)(bVar20 >> 2 & 1) * (int)pfVar1[10];
              auVar33._44_4_ = (uint)(bVar20 >> 3 & 1) * (int)pfVar1[0xb];
              auVar33._48_4_ = (uint)(bVar20 >> 4 & 1) * (int)pfVar1[0xc];
              auVar33._52_4_ = (uint)(bVar20 >> 5 & 1) * (int)pfVar1[0xd];
              auVar33._56_4_ = (uint)(bVar20 >> 6 & 1) * (int)pfVar1[0xe];
              auVar33._60_4_ = (uint)(bVar20 >> 7) * (int)pfVar1[0xf];
              auVar33 = vmulps_avx512f(auVar32,auVar33);
              pfVar1 = destP + (long)iVar22 + uVar26;
              bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar28 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar28 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar28 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar28 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar28 >> 6) & 1);
              bVar10 = (bool)((byte)(uVar28 >> 7) & 1);
              bVar11 = (bool)(bVar20 >> 1 & 1);
              bVar12 = (bool)(bVar20 >> 2 & 1);
              bVar13 = (bool)(bVar20 >> 3 & 1);
              bVar14 = (bool)(bVar20 >> 4 & 1);
              bVar15 = (bool)(bVar20 >> 5 & 1);
              bVar16 = (bool)(bVar20 >> 6 & 1);
              *pfVar1 = (float)((uint)(bVar19 & 1) * auVar33._0_4_ |
                               (uint)!(bool)(bVar19 & 1) * (int)*pfVar1);
              pfVar1[1] = (float)((uint)bVar18 * auVar33._4_4_ | (uint)!bVar18 * (int)pfVar1[1]);
              pfVar1[2] = (float)((uint)bVar5 * auVar33._8_4_ | (uint)!bVar5 * (int)pfVar1[2]);
              pfVar1[3] = (float)((uint)bVar6 * auVar33._12_4_ | (uint)!bVar6 * (int)pfVar1[3]);
              pfVar1[4] = (float)((uint)bVar7 * auVar33._16_4_ | (uint)!bVar7 * (int)pfVar1[4]);
              pfVar1[5] = (float)((uint)bVar8 * auVar33._20_4_ | (uint)!bVar8 * (int)pfVar1[5]);
              pfVar1[6] = (float)((uint)bVar9 * auVar33._24_4_ | (uint)!bVar9 * (int)pfVar1[6]);
              pfVar1[7] = (float)((uint)bVar10 * auVar33._28_4_ | (uint)!bVar10 * (int)pfVar1[7]);
              pfVar1[8] = (float)((uint)(bVar20 & 1) * auVar33._32_4_ |
                                 (uint)!(bool)(bVar20 & 1) * (int)pfVar1[8]);
              pfVar1[9] = (float)((uint)bVar11 * auVar33._36_4_ | (uint)!bVar11 * (int)pfVar1[9]);
              pfVar1[10] = (float)((uint)bVar12 * auVar33._40_4_ | (uint)!bVar12 * (int)pfVar1[10]);
              pfVar1[0xb] = (float)((uint)bVar13 * auVar33._44_4_ | (uint)!bVar13 * (int)pfVar1[0xb]
                                   );
              pfVar1[0xc] = (float)((uint)bVar14 * auVar33._48_4_ | (uint)!bVar14 * (int)pfVar1[0xc]
                                   );
              pfVar1[0xd] = (float)((uint)bVar15 * auVar33._52_4_ | (uint)!bVar15 * (int)pfVar1[0xd]
                                   );
              pfVar1[0xe] = (float)((uint)bVar16 * auVar33._56_4_ | (uint)!bVar16 * (int)pfVar1[0xe]
                                   );
              pfVar1[0xf] = (float)((uint)(bVar20 >> 7) * auVar33._60_4_ |
                                   (uint)!(bool)(bVar20 >> 7) * (int)pfVar1[0xf]);
              uVar26 = uVar26 + 0x10;
            } while ((iVar21 + 0xfU & 0xfffffff0) != uVar26);
          }
          iVar24 = iVar24 + 1;
          iVar22 = iVar22 + iVar2 * iVar23;
        } while (iVar24 != iVar4);
      }
      if ((this->kFlags & 0x400) == 0) {
        scaleFactors[lVar27] = fVar29;
        if (cumulativeScaleFactors != (float *)0x0) {
          dVar35 = log((double)fVar29);
          fVar29 = (float)(dVar35 + (double)cumulativeScaleFactors[lVar27]);
LAB_0013d4ff:
          cumulativeScaleFactors[lVar27] = fVar29;
        }
      }
      else {
        dVar35 = log((double)fVar29);
        scaleFactors[lVar27] = (float)dVar35;
        if (cumulativeScaleFactors != (float *)0x0) {
          fVar29 = (float)dVar35 + cumulativeScaleFactors[lVar27];
          goto LAB_0013d4ff;
        }
      }
      lVar27 = lVar27 + 1;
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (lVar27 != iVar3);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(REALTYPE* destP,
                                                                   REALTYPE* scaleFactors,
                                                                   REALTYPE* cumulativeScaleFactors,
                                                                   const int fillWithOnes,
                                                                   const int partitionIndex) {

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    // TODO None of the code below has been optimized.
    for (int k = startPattern; k < endPattern; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}